

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixFileSystem.cpp
# Opt level: O0

bool __thiscall fs::FolderDescriptor::Impl::reset(Impl *this)

{
  bool bVar1;
  dirent *pdVar2;
  Impl *this_local;
  
  bVar1 = validDir(this);
  if (bVar1) {
    rewinddir((DIR *)this->_dir);
    pdVar2 = readdir((DIR *)this->_dir);
    this->_file = (File)pdVar2;
  }
  return bVar1;
}

Assistant:

bool FolderDescriptor::Impl::reset() noexcept
  {
	  if (validDir())
	  {
		  rewinddir(_dir);
		  _file = readdir(_dir);
		  return true;
	  }
	  return false;
  }